

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mangle.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  ostream *poVar3;
  element_type *peVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  exception *ex;
  uint8_t new_value;
  size_t offset;
  size_t ctr;
  size_t num_to_hit;
  element_type *ptr;
  shared_ptr<unsigned_char> data;
  memory_mapper mapper;
  string local_1de8 [32];
  undefined1 local_1dc8 [8];
  file_handle file;
  unsigned_long header_size;
  undefined1 local_1d80 [8];
  random_generator<unsigned_long> rand;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  rand.distribution_._M_param._M_b._4_4_ = 0;
  if (argc == 2) {
    anon_unknown.dwarf_2066::random_generator<unsigned_long>::random_generator
              ((random_generator<unsigned_long> *)local_1d80);
    file.file_ = 0xb0;
    file.is_writable_ = false;
    file._45_3_ = 0;
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1de8,pcVar1,(allocator *)((long)&mapper.super_memory_mapper_base.size_ + 7));
    pstore::file::file_handle::file_handle((file_handle *)local_1dc8,(string *)local_1de8);
    std::__cxx11::string::~string(local_1de8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&mapper.super_memory_mapper_base.size_ + 7));
    pstore::file::file_handle::open((file_handle *)local_1dc8,(char *)0x1,1,0);
    pstore::memory_mapper::memory_mapper
              ((memory_mapper *)
               &data.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (file_handle *)local_1dc8,true,0,0xb0);
    pstore::memory_mapper_base::data
              ((memory_mapper_base *)
               &data.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&ptr);
    peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&ptr);
    uVar5 = anon_unknown.dwarf_2066::random_generator<unsigned_long>::get
                      ((random_generator<unsigned_long> *)local_1d80,0x11);
    for (offset = 0; offset < uVar5; offset = offset + 1) {
      uVar6 = anon_unknown.dwarf_2066::random_generator<unsigned_long>::get
                        ((random_generator<unsigned_long> *)local_1d80,0xb0);
      uVar7 = anon_unknown.dwarf_2066::random_generator<unsigned_long>::get
                        ((random_generator<unsigned_long> *)local_1d80);
      bVar2 = std::numeric_limits<unsigned_char>::max();
      ex._7_1_ = (byte)(uVar7 % (ulong)bVar2);
      uVar7 = anon_unknown.dwarf_2066::random_generator<unsigned_long>::get
                        ((random_generator<unsigned_long> *)local_1d80);
      if ((uVar7 & 1) != 0) {
        ex._7_1_ = ex._7_1_ | 0x80;
      }
      peVar4[uVar6] = ex._7_1_;
    }
    std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&ptr);
    pstore::memory_mapper::~memory_mapper
              ((memory_mapper *)
               &data.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pstore::file::file_handle::~file_handle((file_handle *)local_1dc8);
    anon_unknown.dwarf_2066::random_generator<unsigned_long>::~random_generator
              ((random_generator<unsigned_long> *)local_1d80);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Mangle returning ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,rand.distribution_._M_param._M_b._4_4_);
    std::operator<<(poVar3,'\n');
    argv_local._4_4_ = rand.distribution_._M_param._M_b._4_4_;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," path-name\n");
    poVar3 = std::operator<<(poVar3," \"Fuzzes\" the header and r0 footer of the given file.\n");
    std::operator<<(poVar3," Warning: The file is modified in-place.\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char ** argv) {
    int exit_code = EXIT_SUCCESS;

    if (argc != 2) {
        std::cout << "Usage: " << argv[0] << " path-name\n"
                  << " \"Fuzzes\" the header and r0 footer of the given file.\n"
                  << " Warning: The file is modified in-place.\n";
        return EXIT_FAILURE;
    }

    PSTORE_TRY {
        random_generator<std::size_t> rand;

        auto const header_size = pstore::leader_size + sizeof (pstore::trailer);

        pstore::file::file_handle file{argv[1]};
        file.open (pstore::file::file_handle::create_mode::open_existing,
                   pstore::file::file_handle::writable_mode::read_write);
        pstore::memory_mapper mapper (file,
                                      true,         // writable
                                      0,            // offset
                                      header_size); // length
        auto data = std::static_pointer_cast<std::uint8_t> (mapper.data ());
        auto ptr = data.get ();

        std::size_t const num_to_hit = rand.get (header_size / 10);
        for (std::size_t ctr = 0; ctr < num_to_hit; ctr++) {
            std::size_t const offset = rand.get (header_size);
            std::uint8_t new_value = rand.get () % std::numeric_limits<std::uint8_t>::max ();

            // We want the highest bit set more often, in case of signedness issues.
            if (rand.get () % 2) {
                new_value |= 0x80;
            }

            ptr[offset] = new_value;
        }
    }